

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

void destroy_charmaps(FT_Face face,FT_Memory memory)

{
  FT_CharMap *ppFVar1;
  long lVar2;
  
  if (face != (FT_Face)0x0) {
    for (lVar2 = 0; ppFVar1 = face->charmaps, lVar2 < face->num_charmaps; lVar2 = lVar2 + 1) {
      ft_cmap_done_internal((FT_CMap_conflict)ppFVar1[lVar2]);
      face->charmaps[lVar2] = (FT_CharMap)0x0;
    }
    if (ppFVar1 != (FT_CharMap *)0x0) {
      (*memory->free)(memory,ppFVar1);
    }
    face->charmaps = (FT_CharMap *)0x0;
    face->num_charmaps = 0;
  }
  return;
}

Assistant:

static void
  destroy_charmaps( FT_Face    face,
                    FT_Memory  memory )
  {
    FT_Int  n;


    if ( !face )
      return;

    for ( n = 0; n < face->num_charmaps; n++ )
    {
      FT_CMap  cmap = FT_CMAP( face->charmaps[n] );


      ft_cmap_done_internal( cmap );

      face->charmaps[n] = NULL;
    }

    FT_FREE( face->charmaps );
    face->num_charmaps = 0;
  }